

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn.c
# Opt level: O0

uc_err reg_write_ppc(void *_env,int mode,uint regid,void *value,size_t *size,int *setpc)

{
  uint local_4c;
  int local_48;
  uint32_t val;
  int i;
  uc_err ret;
  CPUPPCState *env;
  int *setpc_local;
  size_t *size_local;
  void *value_local;
  uint regid_local;
  int mode_local;
  void *_env_local;
  
  val = 0xf;
  if ((regid < 2) || (0x21 < regid)) {
    if ((regid < 0x2a) || (0x49 < regid)) {
      if ((regid < 0x22) || (0x29 < regid)) {
        if (regid == 1) {
          if (*size < 4) {
            return UC_ERR_OVERFLOW;
          }
          *size = 4;
          val = 0;
          *(undefined4 *)((long)_env + 0x160) = *value;
          *setpc = 1;
        }
        else if (regid == 0x4a) {
          if (*size < 4) {
            return UC_ERR_OVERFLOW;
          }
          *size = 4;
          val = 0;
          *(undefined4 *)((long)_env + 0x100) = *value;
        }
        else if (regid == 0x4b) {
          if (*size < 4) {
            return UC_ERR_OVERFLOW;
          }
          *size = 4;
          val = 0;
          *(undefined4 *)((long)_env + 0x128) = *value;
        }
        else if (regid == 0x4c) {
          if (*size < 4) {
            return UC_ERR_OVERFLOW;
          }
          *size = 4;
          val = 0;
          *(undefined4 *)((long)_env + 0x104) = *value;
        }
        else if (regid == 0x4d) {
          if (*size < 4) {
            return UC_ERR_OVERFLOW;
          }
          *size = 4;
          val = 0;
          uc_ppc_store_msr((CPUPPCState *)_env,(ulong)*value,0);
        }
        else if (regid == 0x4e) {
          if (*size < 4) {
            return UC_ERR_OVERFLOW;
          }
          *size = 4;
          val = 0;
          store_fpscr((CPUPPCState_conflict *)_env,(ulong)*value,0xffffffff);
        }
        else if (regid == 0x4f) {
          if (*size < 4) {
            return UC_ERR_OVERFLOW;
          }
          *size = 4;
          val = 0;
          local_4c = *value;
          for (local_48 = 7; -1 < local_48; local_48 = local_48 + -1) {
            *(uint *)((long)_env + (long)local_48 * 4 + 0x108) = local_4c & 0xf;
            local_4c = local_4c >> 4;
          }
        }
      }
      else {
        if (*size < 4) {
          return UC_ERR_OVERFLOW;
        }
        *size = 4;
        val = 0;
        *(uint *)((long)_env + (ulong)(regid - 0x22) * 4 + 0x108) = *value & 0xf;
      }
    }
    else {
      if (*size < 8) {
        return UC_ERR_OVERFLOW;
      }
      *size = 8;
      val = 0;
      *(undefined8 *)((long)_env + (ulong)(regid - 0x2a) * 0x10 + 0x112c8) = *value;
    }
  }
  else {
    if (*size < 4) {
      return UC_ERR_OVERFLOW;
    }
    *size = 4;
    val = 0;
    *(undefined4 *)((long)_env + (ulong)(regid - 2) * 4) = *value;
  }
  return val;
}

Assistant:

DEFAULT_VISIBILITY
uc_err reg_write(void *_env, int mode, unsigned int regid, const void *value,
                 size_t *size, int *setpc)
{
    CPUPPCState *env = _env;
    uc_err ret = UC_ERR_ARG;

    if (regid >= UC_PPC_REG_0 && regid <= UC_PPC_REG_31) {
        CHECK_REG_TYPE(ppcreg_t);
        env->gpr[regid - UC_PPC_REG_0] = *(ppcreg_t *)value;
    } else if (regid >= UC_PPC_REG_FPR0 && regid <= UC_PPC_REG_FPR31) {
        CHECK_REG_TYPE(uint64_t);
        env->vsr[regid - UC_PPC_REG_FPR0].VsrD(0) = *(uint64_t *)value;
    } else if (regid >= UC_PPC_REG_CR0 && regid <= UC_PPC_REG_CR7) {
        CHECK_REG_TYPE(uint32_t);
        env->crf[regid - UC_PPC_REG_CR0] = (*(uint32_t *)value) & 0b1111;
    } else {
        switch (regid) {
        default:
            break;
        case UC_PPC_REG_PC:
            CHECK_REG_TYPE(ppcreg_t);
            env->nip = *(ppcreg_t *)value;
            *setpc = 1;
            break;
        case UC_PPC_REG_CR: {
            CHECK_REG_TYPE(uint32_t);
            int i;
            uint32_t val = *(uint32_t *)value;
            for (i = 7; i >= 0; i--) {
                env->crf[i] = val & 0b1111;
                val >>= 4;
            }
            break;
        }
        case UC_PPC_REG_LR:
            CHECK_REG_TYPE(ppcreg_t);
            env->lr = *(ppcreg_t *)value;
            break;
        case UC_PPC_REG_CTR:
            CHECK_REG_TYPE(ppcreg_t);
            env->ctr = *(ppcreg_t *)value;
            break;
        case UC_PPC_REG_MSR:
            CHECK_REG_TYPE(ppcreg_t);
            uc_ppc_store_msr(env, *(ppcreg_t *)value, 0);
            break;
        case UC_PPC_REG_XER:
            CHECK_REG_TYPE(uint32_t);
            env->xer = *(uint32_t *)value;
            break;
        case UC_PPC_REG_FPSCR:
            CHECK_REG_TYPE(uint32_t);
            store_fpscr(env, *(uint32_t *)value, 0xffffffff);
            break;
        }
    }

    return ret;
}